

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_engine.cpp
# Opt level: O2

void __thiscall
polyscope::render::backend_openGL3_glfw::GLShaderProgram::~GLShaderProgram(GLShaderProgram *this)

{
  pointer pGVar1;
  pointer attribute;
  
  (this->super_ShaderProgram)._vptr_ShaderProgram = (_func_int **)&PTR__GLShaderProgram_0047e0c0;
  pGVar1 = (this->attributes).
           super__Vector_base<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderAttribute,_std::allocator<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderAttribute>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (attribute = (this->attributes).
                   super__Vector_base<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderAttribute,_std::allocator<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderAttribute>_>
                   ._M_impl.super__Vector_impl_data._M_start; attribute != pGVar1;
      attribute = attribute + 1) {
    deleteAttributeBuffer(this,attribute);
  }
  (*glad_glDeleteProgram)(this->programHandle);
  std::
  vector<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderTexture,_std::allocator<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderTexture>_>
  ::~vector(&this->textures);
  std::
  vector<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderAttribute,_std::allocator<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderAttribute>_>
  ::~vector(&this->attributes);
  std::
  vector<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderUniform,_std::allocator<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderUniform>_>
  ::~vector(&this->uniforms);
  return;
}

Assistant:

GLShaderProgram::~GLShaderProgram() {
  // Make sure that we free the buffers for all attributes
  for (GLShaderAttribute& a : attributes) {
    deleteAttributeBuffer(a);
  }

  // Free the program
  glDeleteProgram(programHandle);
}